

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O2

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  void *__ptr;
  ssize_t sVar2;
  ssize_t extraout_RAX;
  char __nbytes_00 [8];
  char buffer_header [8];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  buffer_header[0] = '\0';
  buffer_header[1] = '\0';
  buffer_header[2] = '\0';
  buffer_header[3] = '\0';
  buffer_header[4] = '\0';
  buffer_header[5] = '\0';
  buffer_header[6] = '\0';
  buffer_header[7] = '\0';
  read(__fd,buffer_header,8);
  __nbytes_00 = buffer_header;
  __ptr = calloc(1,(size_t)buffer_header);
  iVar1 = 0;
  for (; __nbytes_00 != (char  [8])0x0;
      __nbytes_00 = (char  [8])((long)__nbytes_00 - (long)(int)sVar2)) {
    sVar2 = read(__fd,(void *)((long)__ptr + (long)iVar1),(size_t)__nbytes_00);
    iVar1 = (int)sVar2 + iVar1;
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,__ptr,(long)__ptr + (long)iVar1);
  std::__cxx11::string::operator=((string *)__buf,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  free(__ptr);
  return extraout_RAX;
}

Assistant:

void read(int new_socket, string& msg) {
	int valread;
	char buffer_header[sizeof(size_t)] = {0}; 
	valread = read( new_socket , buffer_header, sizeof(size_t));

	size_t msg_size;
	memcpy(&msg_size, buffer_header, sizeof(size_t));

	char* buffer_msg = (char*)malloc(msg_size*sizeof(char));
	memset(buffer_msg, '\0', sizeof(char)*msg_size);
	int length = 0;
	for(length = 0; msg_size != 0; length += valread) {
		valread = read( new_socket , buffer_msg+length, msg_size);
		msg_size -= valread;
	}

	msg = std::string(buffer_msg, length);
	free(buffer_msg);
}